

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

int Curl_debug(Curl_easy *data,curl_infotype type,char *ptr,size_t size,connectdata *conn)

{
  bool bVar1;
  int iVar2;
  size_t size_00;
  char *pcVar3;
  char *pcVar4;
  char buffer [160];
  char acStack_d8 [168];
  
  if (((conn == (connectdata *)0x0) || ((data->set).printhost == false)) ||
     ((conn->host).dispname == (char *)0x0)) goto LAB_00113b04;
  pcVar3 = "Data";
  switch(type - CURLINFO_HEADER_IN) {
  case CURLINFO_TEXT:
    pcVar3 = "Header";
  case CURLINFO_HEADER_OUT:
    pcVar4 = "from";
    break;
  case CURLINFO_HEADER_IN:
    pcVar3 = "Header";
  case CURLINFO_DATA_IN:
    pcVar4 = "to";
    break;
  default:
    iVar2 = (int)CONCAT71((uint7)(uint3)(type - CURLINFO_HEADER_IN >> 8),1);
    pcVar4 = (char *)0x0;
    goto LAB_00113ac1;
  }
  iVar2 = 0;
LAB_00113ac1:
  if ((char)iVar2 == '\0') {
    bVar1 = false;
    curl_msnprintf(acStack_d8,0xa0,"[%s %s %s]",pcVar3,pcVar4);
    size_00 = strlen(acStack_d8);
    iVar2 = showit(data,CURLINFO_TEXT,acStack_d8,size_00);
    if (iVar2 == 0) goto LAB_00113afc;
  }
  else {
LAB_00113afc:
    bVar1 = true;
  }
  if (!bVar1) {
    return iVar2;
  }
LAB_00113b04:
  iVar2 = showit(data,type,ptr,size);
  return iVar2;
}

Assistant:

int Curl_debug(struct Curl_easy *data, curl_infotype type,
               char *ptr, size_t size,
               struct connectdata *conn)
{
  int rc;
  if(data->set.printhost && conn && conn->host.dispname) {
    char buffer[160];
    const char *t = NULL;
    const char *w = "Data";
    switch(type) {
    case CURLINFO_HEADER_IN:
      w = "Header";
      /* FALLTHROUGH */
    case CURLINFO_DATA_IN:
      t = "from";
      break;
    case CURLINFO_HEADER_OUT:
      w = "Header";
      /* FALLTHROUGH */
    case CURLINFO_DATA_OUT:
      t = "to";
      break;
    default:
      break;
    }

    if(t) {
      snprintf(buffer, sizeof(buffer), "[%s %s %s]", w, t,
               conn->host.dispname);
      rc = showit(data, CURLINFO_TEXT, buffer, strlen(buffer));
      if(rc)
        return rc;
    }
  }
  rc = showit(data, type, ptr, size);
  return rc;
}